

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjunctiveMonotone.c
# Opt level: O3

int Vec_IntPushUniqueLocal(Vec_Int_t *p,int Entry)

{
  long lVar1;
  
  if (0 < (long)p->nSize) {
    lVar1 = 0;
    do {
      if (p->pArray[lVar1] == Entry) {
        return 1;
      }
      lVar1 = lVar1 + 1;
    } while (p->nSize != lVar1);
  }
  Vec_IntPush(p,Entry);
  return 0;
}

Assistant:

int Vec_IntPushUniqueLocal( Vec_Int_t * p, int Entry )
{
    int i;
    for ( i = 0; i < p->nSize; i++ )
        if ( p->pArray[i] == Entry )
            return 1;
    Vec_IntPush( p, Entry );
    return 0;
}